

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O2

void __thiscall wasm::FunctionValidator::visitRefNull(FunctionValidator *this,RefNull *curr)

{
  ulong uVar1;
  FeatureSet FVar2;
  ostream *poVar3;
  FeatureSet feats;
  Type *this_00;
  bool bVar4;
  string local_58;
  Type *local_38;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type;
  FVar2 = wasm::Type::getFeatures(this_00);
  if ((this->
      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
      ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
      currFunction == (Function *)0x0) {
    bVar4 = true;
  }
  else {
    bVar4 = (FVar2.features &
            ~(((this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
              .currModule)->features).features) == 0;
  }
  feats.features = 0xe5f5eb;
  bVar4 = shouldBeTrue<wasm::RefNull*>(this,bVar4,curr,"ref.null requires additional features ");
  if (!bVar4) {
    local_38 = this_00;
    poVar3 = getStream(this);
    getMissingFeaturesList_abi_cxx11_
              (&local_58,
               (wasm *)(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currModule,(Module *)(ulong)FVar2.features,feats);
    poVar3 = std::operator<<(poVar3,(string *)&local_58);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string((string *)&local_58);
    this_00 = local_38;
  }
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type.id;
  bVar4 = shouldBeTrue<wasm::RefNull*>
                    (this,((uint)uVar1 & 3) == 2 && 6 < uVar1,curr,"ref.null types must be nullable"
                    );
  if (bVar4) {
    bVar4 = wasm::Type::isNull(this_00);
    shouldBeTrue<wasm::RefNull*>(this,bVar4,curr,"ref.null must have a bottom heap type");
  }
  return;
}

Assistant:

void FunctionValidator::visitRefNull(RefNull* curr) {
  // If we are not in a function, this is a global location like a table. We
  // allow RefNull there as we represent tables that way regardless of what
  // features are enabled.
  auto feats = curr->type.getFeatures();
  if (!shouldBeTrue(!getFunction() || feats <= getModule()->features,
                    curr,
                    "ref.null requires additional features ")) {
    getStream() << getMissingFeaturesList(*getModule(), feats) << '\n';
  }
  if (!shouldBeTrue(
        curr->type.isNullable(), curr, "ref.null types must be nullable")) {
    return;
  }
  shouldBeTrue(
    curr->type.isNull(), curr, "ref.null must have a bottom heap type");
}